

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_copy_default_tcp_and_create_tcd
                   (opj_j2k_v2_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *__src;
  void *__dest;
  uint uVar5;
  uint uVar6;
  opj_bool oVar7;
  void *pvVar8;
  ulong uVar9;
  opj_tcd_v2_t *poVar10;
  opj_event_mgr_t *in_RDX;
  long in_RDI;
  OPJ_UINT32 l_offset;
  opj_simple_mcc_decorrelation_data_t *l_dest_mcc_rec;
  opj_simple_mcc_decorrelation_data_t *l_src_mcc_rec;
  opj_mct_data_t *l_dest_mct_rec;
  opj_mct_data_t *l_src_mct_rec;
  OPJ_UINT32 l_mct_records_size;
  OPJ_UINT32 l_mcc_records_size;
  opj_image_t *l_image;
  OPJ_UINT32 l_mct_size;
  OPJ_UINT32 l_tccp_size;
  opj_tccp_t *l_current_tccp;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_UINT32 l_nb_tiles;
  opj_tcp_v2_t *l_default_tcp;
  opj_tcp_v2_t *l_tcp;
  undefined4 in_stack_ffffffffffffff78;
  opj_bool in_stack_ffffffffffffff7c;
  opj_image_t *in_stack_ffffffffffffff80;
  opj_tcd_v2_t *in_stack_ffffffffffffff88;
  long local_70;
  long local_68;
  uint local_3c;
  uint local_38;
  void *local_28;
  opj_bool local_4;
  
  lVar4 = *(long *)(in_RDI + 0x60);
  iVar1 = *(int *)(in_RDI + 0x94);
  iVar2 = *(int *)(in_RDI + 0x90);
  local_28 = *(void **)(in_RDI + 0xd0);
  iVar3 = *(int *)(lVar4 + 0x10);
  __src = *(void **)(in_RDI + 0x10);
  uVar5 = *(int *)(lVar4 + 0x10) * *(int *)(lVar4 + 0x10) * 4;
  local_38 = 0;
  while( true ) {
    if ((uint)(iVar1 * iVar2) <= local_38) {
      poVar10 = tcd_create_v2(in_stack_ffffffffffffff7c);
      *(opj_tcd_v2_t **)(in_RDI + 0x120) = poVar10;
      if (*(long *)(in_RDI + 0x120) == 0) {
        local_4 = 0;
      }
      else {
        oVar7 = tcd_init_v2(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            (opj_cp_v2_t *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        if (oVar7 == 0) {
          tcd_destroy_v2((opj_tcd_v2_t *)0x13d12b);
          *(undefined8 *)(in_RDI + 0x120) = 0;
          opj_event_msg_v2(in_RDX,1,"Cannot decode tile, memory error\n");
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      return local_4;
    }
    __dest = *(void **)((long)local_28 + 0x15d0);
    memcpy(local_28,__src,0x1630);
    *(byte *)((long)local_28 + 0x1628) = *(byte *)((long)local_28 + 0x1628) & 0xfe;
    *(undefined8 *)((long)local_28 + 0x1428) = 0;
    *(void **)((long)local_28 + 0x15d0) = __dest;
    if (*(long *)((long)__src + 0x15f8) != 0) {
      pvVar8 = malloc((ulong)uVar5);
      *(void **)((long)local_28 + 0x15f8) = pvVar8;
      if (*(long *)((long)local_28 + 0x15f8) == 0) {
        return 0;
      }
      memcpy(*(void **)((long)local_28 + 0x15f8),*(void **)((long)__src + 0x15f8),(ulong)uVar5);
    }
    uVar6 = *(int *)((long)__src + 0x1614) << 5;
    pvVar8 = malloc((ulong)uVar6);
    *(void **)((long)local_28 + 0x1608) = pvVar8;
    if (*(long *)((long)local_28 + 0x1608) == 0) {
      return 0;
    }
    memcpy(*(void **)((long)local_28 + 0x1608),*(void **)((long)__src + 0x1608),(ulong)uVar6);
    local_68 = *(long *)((long)__src + 0x1608);
    local_70 = *(long *)((long)local_28 + 0x1608);
    for (local_3c = 0; local_3c < *(uint *)((long)__src + 0x1610); local_3c = local_3c + 1) {
      if (*(long *)(local_68 + 0x10) != 0) {
        pvVar8 = malloc((ulong)*(uint *)(local_68 + 0x18));
        *(void **)(local_70 + 0x10) = pvVar8;
        if (*(long *)(local_70 + 0x10) == 0) {
          return 0;
        }
        memcpy(*(void **)(local_70 + 0x10),*(void **)(local_68 + 0x10),
               (ulong)*(uint *)(local_68 + 0x18));
      }
      local_68 = local_68 + 0x20;
      local_70 = local_70 + 0x20;
    }
    uVar6 = *(int *)((long)__src + 0x1624) << 5;
    pvVar8 = malloc((ulong)uVar6);
    *(void **)((long)local_28 + 0x1618) = pvVar8;
    if (*(long *)((long)local_28 + 0x1618) == 0) break;
    memcpy(*(void **)((long)local_28 + 0x1618),*(void **)((long)__src + 0x1618),(ulong)uVar6);
    in_stack_ffffffffffffff88 = *(opj_tcd_v2_t **)((long)__src + 0x1618);
    in_stack_ffffffffffffff80 = *(opj_image_t **)((long)local_28 + 0x1618);
    for (local_3c = 0; local_3c < *(uint *)((long)__src + 0x1624); local_3c = local_3c + 1) {
      lVar4._0_4_ = in_stack_ffffffffffffff88->cur_tp_num;
      lVar4._4_4_ = in_stack_ffffffffffffff88->cur_totnum_tp;
      if (lVar4 != 0) {
        uVar9 = *(long *)&in_stack_ffffffffffffff88->cur_tp_num - *(long *)((long)__src + 0x1608) >>
                5;
        in_stack_ffffffffffffff7c = (opj_bool)uVar9;
        *(ulong *)&in_stack_ffffffffffffff80->x1 =
             *(long *)((long)local_28 + 0x1608) + (uVar9 & 0xffffffff) * 0x20;
      }
      if (*(long *)&in_stack_ffffffffffffff88->cur_pino != 0) {
        uVar9 = *(long *)&in_stack_ffffffffffffff88->cur_pino - *(long *)((long)__src + 0x1608) >> 5
        ;
        in_stack_ffffffffffffff7c = (opj_bool)uVar9;
        *(ulong *)&in_stack_ffffffffffffff80->numcomps =
             *(long *)((long)local_28 + 0x1608) + (uVar9 & 0xffffffff) * 0x20;
      }
      in_stack_ffffffffffffff88 = (opj_tcd_v2_t *)&in_stack_ffffffffffffff88->image;
      in_stack_ffffffffffffff80 = (opj_image_t *)&in_stack_ffffffffffffff80->icc_profile_buf;
    }
    memcpy(__dest,*(void **)((long)__src + 0x15d0),(ulong)(uint)(iVar3 * 0x438));
    local_28 = (void *)((long)local_28 + 0x1630);
    local_38 = local_38 + 1;
  }
  return 0;
}

Assistant:

opj_bool j2k_copy_default_tcp_and_create_tcd
						(
						opj_j2k_v2_t * p_j2k,
						opj_stream_private_t *p_stream,
						opj_event_mgr_t * p_manager
						)
{
	opj_tcp_v2_t * l_tcp = 00;
	opj_tcp_v2_t * l_default_tcp = 00;
	OPJ_UINT32 l_nb_tiles;
	OPJ_UINT32 i,j;
	opj_tccp_t *l_current_tccp = 00;
	OPJ_UINT32 l_tccp_size;
	OPJ_UINT32 l_mct_size;
	opj_image_t * l_image;
	OPJ_UINT32 l_mcc_records_size,l_mct_records_size;
	opj_mct_data_t * l_src_mct_rec, *l_dest_mct_rec;
	opj_simple_mcc_decorrelation_data_t * l_src_mcc_rec, *l_dest_mcc_rec;
	OPJ_UINT32 l_offset;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_stream != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
	l_tcp = p_j2k->m_cp.tcps;
	l_tccp_size = l_image->numcomps * sizeof(opj_tccp_t);
	l_default_tcp = p_j2k->m_specific_param.m_decoder.m_default_tcp;
	l_mct_size = l_image->numcomps * l_image->numcomps * sizeof(OPJ_FLOAT32);

	/* For each tile */
	for (i=0; i<l_nb_tiles; ++i) {
		/* keep the tile-compo coding parameters pointer of the current tile coding parameters*/
		l_current_tccp = l_tcp->tccps;
		/*Copy default coding parameters into the current tile coding parameters*/
		memcpy(l_tcp, l_default_tcp, sizeof(opj_tcp_v2_t));
		/* Initialize some values of the current tile coding parameters*/
		l_tcp->ppt = 0;
		l_tcp->ppt_data = 00;
		/* Reconnect the tile-compo coding parameters pointer to the current tile coding parameters*/
		l_tcp->tccps = l_current_tccp;

		/* Get the mct_decoding_matrix of the dflt_tile_cp and copy them into the current tile cp*/
		if (l_default_tcp->m_mct_decoding_matrix) {
			l_tcp->m_mct_decoding_matrix = (OPJ_FLOAT32*)opj_malloc(l_mct_size);
			if (! l_tcp->m_mct_decoding_matrix ) {
				return OPJ_FALSE;
			}
			memcpy(l_tcp->m_mct_decoding_matrix,l_default_tcp->m_mct_decoding_matrix,l_mct_size);
		}

		/* Get the mct_record of the dflt_tile_cp and copy them into the current tile cp*/
		l_mct_records_size = l_default_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t);
		l_tcp->m_mct_records = (opj_mct_data_t*)opj_malloc(l_mct_records_size);
		if (! l_tcp->m_mct_records) {
			return OPJ_FALSE;
		}
		memcpy(l_tcp->m_mct_records, l_default_tcp->m_mct_records,l_mct_records_size);

		/* Copy the mct record data from dflt_tile_cp to the current tile*/
		l_src_mct_rec = l_default_tcp->m_mct_records;
		l_dest_mct_rec = l_tcp->m_mct_records;

		for (j=0;j<l_default_tcp->m_nb_mct_records;++j) {

			if (l_src_mct_rec->m_data) {

				l_dest_mct_rec->m_data = (OPJ_BYTE*) opj_malloc(l_src_mct_rec->m_data_size);
				if(! l_dest_mct_rec->m_data) {
					return OPJ_FALSE;
				}
				memcpy(l_dest_mct_rec->m_data,l_src_mct_rec->m_data,l_src_mct_rec->m_data_size);
			}

			++l_src_mct_rec;
			++l_dest_mct_rec;
		}

		/* Get the mcc_record of the dflt_tile_cp and copy them into the current tile cp*/
		l_mcc_records_size = l_default_tcp->m_nb_max_mcc_records * sizeof(opj_simple_mcc_decorrelation_data_t);
		l_tcp->m_mcc_records = (opj_simple_mcc_decorrelation_data_t*) opj_malloc(l_mcc_records_size);
		if (! l_tcp->m_mcc_records) {
			return OPJ_FALSE;
		}
		memcpy(l_tcp->m_mcc_records,l_default_tcp->m_mcc_records,l_mcc_records_size);

		/* Copy the mcc record data from dflt_tile_cp to the current tile*/
		l_src_mcc_rec = l_default_tcp->m_mcc_records;
		l_dest_mcc_rec = l_tcp->m_mcc_records;

		for (j=0;j<l_default_tcp->m_nb_max_mcc_records;++j) {

			if (l_src_mcc_rec->m_decorrelation_array) {
				l_offset = l_src_mcc_rec->m_decorrelation_array - l_default_tcp->m_mct_records;
				l_dest_mcc_rec->m_decorrelation_array = l_tcp->m_mct_records + l_offset;
			}

			if (l_src_mcc_rec->m_offset_array) {
				l_offset = l_src_mcc_rec->m_offset_array - l_default_tcp->m_mct_records;
				l_dest_mcc_rec->m_offset_array = l_tcp->m_mct_records + l_offset;
			}

			++l_src_mcc_rec;
			++l_dest_mcc_rec;
		}

		/* Copy all the dflt_tile_compo_cp to the current tile cp */
		memcpy(l_current_tccp,l_default_tcp->tccps,l_tccp_size);

		/* Move to next tile cp*/
		++l_tcp;
	}

	/* Create the current tile decoder*/
	p_j2k->m_tcd = (opj_tcd_v2_t*)tcd_create_v2(OPJ_TRUE); /* FIXME why a cast ? */
	if (! p_j2k->m_tcd ) {
		return OPJ_FALSE;
	}

	if ( !tcd_init_v2(p_j2k->m_tcd, l_image, &(p_j2k->m_cp)) ) {
		tcd_destroy_v2(p_j2k->m_tcd);
		p_j2k->m_tcd = 00;
		opj_event_msg_v2(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
		return OPJ_FALSE;
	}

	return OPJ_TRUE;
}